

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_index_tree.cpp
# Opt level: O1

void __thiscall duckdb::WindowIndexTreeLocalState::BuildLeaves(WindowIndexTreeLocalState *this)

{
  DataChunk *this_00;
  idx_t iVar1;
  WindowIndexTree *pWVar2;
  type global_sort_state;
  reference pvVar3;
  reference pvVar4;
  pointer this_01;
  reference pvVar5;
  pointer this_02;
  size_t __n;
  pointer *__ptr;
  data_ptr_t __src;
  long lVar6;
  value_type vVar7;
  PayloadScanner scanner;
  PayloadScanner local_48;
  
  global_sort_state =
       unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
       operator*(&(this->index_tree->super_WindowMergeSortTree).global_sort);
  if ((global_sort_state->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (global_sort_state->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    PayloadScanner::PayloadScanner
              (&local_48,global_sort_state,(this->super_WindowMergeSortTreeLocalState).build_task,
               false);
    pvVar3 = vector<unsigned_long,_true>::operator[]
                       (&(this->index_tree->super_WindowMergeSortTree).block_starts,
                        (this->super_WindowMergeSortTreeLocalState).build_task);
    vVar7 = *pvVar3;
    this_00 = &(this->super_WindowMergeSortTreeLocalState).payload_chunk;
    do {
      DataChunk::Reset(this_00);
      PayloadScanner::Scan(&local_48,this_00);
      iVar1 = (this->super_WindowMergeSortTreeLocalState).payload_chunk.count;
      if (iVar1 != 0) {
        pvVar4 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
        pWVar2 = this->index_tree;
        if ((pWVar2->super_WindowMergeSortTree).mst32.
            super_unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
            .
            super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_false>
            ._M_head_impl ==
            (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *)0x0) {
          this_02 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
                    ::operator->(&(pWVar2->super_WindowMergeSortTree).mst64);
          pvVar5 = (reference)
                   vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                   ::operator[](&this_02->tree,0);
          __src = pvVar4->data;
          __n = iVar1 * 8;
          lVar6 = vVar7 * 8;
        }
        else {
          this_01 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
                    ::operator->(&(pWVar2->super_WindowMergeSortTree).mst32);
          pvVar5 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                   ::operator[](&this_01->tree,0);
          __src = pvVar4->data;
          __n = iVar1 * 4;
          lVar6 = vVar7 * 4;
        }
        memmove((void *)(lVar6 + (long)(pvVar5->first).
                                       super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start),__src,__n);
        vVar7 = vVar7 + iVar1;
      }
    } while (iVar1 != 0);
    if (local_48.scanner.
        super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
        .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
         )0x0) {
      RowDataCollectionScanner::~RowDataCollectionScanner
                ((RowDataCollectionScanner *)
                 local_48.scanner.
                 super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                 .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl);
      operator_delete((void *)local_48.scanner.
                              super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
                              .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>.
                              _M_head_impl);
    }
    local_48.scanner.
    super_unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::RowDataCollectionScanner_*,_std::default_delete<duckdb::RowDataCollectionScanner>_>
    .super__Head_base<0UL,_duckdb::RowDataCollectionScanner_*,_false>._M_head_impl =
         (unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>_>
          )(__uniq_ptr_data<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true,_true>
            )0x0;
    if (local_48.heap.
        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
         )0x0) {
      ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                 ((long)local_48.heap.
                        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                 0x38));
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 *)((long)local_48.heap.
                          super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                          .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                   0x20));
      operator_delete((void *)local_48.heap.
                              super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                              .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>.
                              _M_head_impl);
    }
    local_48.heap.
    super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
    .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl =
         (unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>)
         (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
          )0x0;
    if (local_48.rows.
        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true,_true>
         )0x0) {
      ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
                ((vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *)
                 ((long)local_48.rows.
                        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                 0x38));
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                 *)((long)local_48.rows.
                          super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                          .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl +
                   0x20));
      operator_delete((void *)local_48.rows.
                              super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
                              .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>.
                              _M_head_impl);
    }
  }
  return;
}

Assistant:

void WindowIndexTreeLocalState::BuildLeaves() {
	auto &global_sort = *index_tree.global_sort;
	if (global_sort.sorted_blocks.empty()) {
		return;
	}

	PayloadScanner scanner(global_sort, build_task);
	idx_t row_idx = index_tree.block_starts[build_task];
	for (;;) {
		payload_chunk.Reset();
		scanner.Scan(payload_chunk);
		const auto count = payload_chunk.size();
		if (count == 0) {
			break;
		}
		auto &indices = payload_chunk.data[0];
		if (index_tree.mst32) {
			auto &sorted = index_tree.mst32->LowestLevel();
			auto data = FlatVector::GetData<uint32_t>(indices);
			std::copy(data, data + count, sorted.data() + row_idx);
		} else {
			auto &sorted = index_tree.mst64->LowestLevel();
			auto data = FlatVector::GetData<uint64_t>(indices);
			std::copy(data, data + count, sorted.data() + row_idx);
		}
		row_idx += count;
	}
}